

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O0

SharedPtr<const_ElementDefinition> __thiscall
Rml::StyleSheet::GetElementDefinition(StyleSheet *this,Element *element)

{
  bool bVar1;
  int iVar2;
  String *__lhs;
  String *key;
  ElementStyle *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ulong uVar3;
  reference key_00;
  reference ppSVar4;
  Element *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<const_ElementDefinition> SVar5;
  vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_> local_d0;
  SharedPtr<const_ElementDefinition> *definition;
  StyleSheetNode **local_b0;
  StyleSheetNode **local_a8;
  StyleSheetNode *local_a0;
  StyleSheetNode *node;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  NodeList *__range1_1;
  String *name;
  const_iterator __end1;
  const_iterator __begin1;
  StringList *__range1;
  StringList *class_names;
  String *id;
  String *tag;
  anon_class_8_1_203d51dc AddApplicableNodes;
  RmlUiAssertNonrecursive rmlui_nonrecursive;
  Element *element_local;
  StyleSheet *this_local;
  
  RmlUiAssertNonrecursive::RmlUiAssertNonrecursive
            ((RmlUiAssertNonrecursive *)&AddApplicableNodes,
             &GetElementDefinition::rmlui_nonrecursive_entered);
  if ((GetElementDefinition(Rml::Element_const*)::applicable_nodes == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetElementDefinition(Rml::Element_const*)::applicable_nodes),
     iVar2 != 0)) {
    ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::vector
              (&GetElementDefinition::applicable_nodes);
    __cxa_atexit(::std::
                 vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
                 ~vector,&GetElementDefinition::applicable_nodes,&__dso_handle);
    __cxa_guard_release(&GetElementDefinition(Rml::Element_const*)::applicable_nodes);
  }
  ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::clear
            (&GetElementDefinition::applicable_nodes);
  __lhs = Element::GetTagName_abi_cxx11_(in_RDX);
  key = Element::GetId_abi_cxx11_(in_RDX);
  this_00 = Element::GetStyle(in_RDX);
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)ElementStyle::GetClassNameList_abi_cxx11_(this_00);
  bVar1 = ::std::operator==(__lhs,"#text");
  if (bVar1) {
    ::std::shared_ptr<const_Rml::ElementDefinition>::shared_ptr
              ((shared_ptr<const_Rml::ElementDefinition> *)this,(nullptr_t)0x0);
  }
  else {
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      GetElementDefinition::anon_class_8_1_203d51dc::operator()
                ((anon_class_8_1_203d51dc *)&tag,(NodeIndex *)&element->offset_parent,key);
    }
    __end1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    name = (String *)
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&name), bVar1) {
      key_00 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      GetElementDefinition::anon_class_8_1_203d51dc::operator()
                ((anon_class_8_1_203d51dc *)&tag,(NodeIndex *)&element->main_box,key_00);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    GetElementDefinition::anon_class_8_1_203d51dc::operator()
              ((anon_class_8_1_203d51dc *)&tag,(NodeIndex *)((element->main_box).area_edges[2] + 2),
               __lhs);
    __end1_1 = ::std::
               vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
               begin((vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                      *)&element->stacking_context);
    node = (StyleSheetNode *)
           ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
           ::end((vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  *)&element->stacking_context);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_Rml::StyleSheetNode_*const_*,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
                               *)&node), bVar1) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<const_Rml::StyleSheetNode_*const_*,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
                ::operator*(&__end1_1);
      local_a0 = *ppSVar4;
      bVar1 = StyleSheetNode::IsApplicable(local_a0,in_RDX,(Element *)0x0);
      if (bVar1) {
        ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
        push_back(&GetElementDefinition::applicable_nodes,&local_a0);
      }
      __gnu_cxx::
      __normal_iterator<const_Rml::StyleSheetNode_*const_*,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
      ::operator++(&__end1_1);
    }
    bVar1 = ::std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
            ::empty(&GetElementDefinition::applicable_nodes);
    if (bVar1) {
      ::std::shared_ptr<const_Rml::ElementDefinition>::shared_ptr
                ((shared_ptr<const_Rml::ElementDefinition> *)this,(nullptr_t)0x0);
    }
    else {
      local_a8 = (StyleSheetNode **)
                 ::std::
                 vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
                 begin(&GetElementDefinition::applicable_nodes);
      local_b0 = (StyleSheetNode **)
                 ::std::
                 vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
                 end(&GetElementDefinition::applicable_nodes);
      ::std::
      sort<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>
                (local_a8,local_b0);
      local_d0.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)robin_hood::detail::
                    Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                    ::operator[]<std::shared_ptr<Rml::ElementDefinition_const>>
                              ((Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                                *)&element->transform_state,&GetElementDefinition::applicable_nodes)
      ;
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         local_d0.
                         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        MakeShared<Rml::ElementDefinition_const,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>&>
                  (&local_d0);
        ::std::shared_ptr<const_Rml::ElementDefinition>::operator=
                  ((shared_ptr<const_Rml::ElementDefinition> *)
                   local_d0.
                   super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (shared_ptr<const_Rml::ElementDefinition> *)&local_d0);
        ::std::shared_ptr<const_Rml::ElementDefinition>::~shared_ptr
                  ((shared_ptr<const_Rml::ElementDefinition> *)&local_d0);
      }
      ::std::shared_ptr<const_Rml::ElementDefinition>::shared_ptr
                ((shared_ptr<const_Rml::ElementDefinition> *)this,
                 (shared_ptr<const_Rml::ElementDefinition> *)
                 local_d0.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  RmlUiAssertNonrecursive::~RmlUiAssertNonrecursive((RmlUiAssertNonrecursive *)&AddApplicableNodes);
  SVar5.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar5.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<const_ElementDefinition>)
         SVar5.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<const ElementDefinition> StyleSheet::GetElementDefinition(const Element* element) const
{
	RMLUI_ASSERT_NONRECURSIVE;

	// Using static to avoid allocations. Make sure we don't call this function recursively.
	static Vector<const StyleSheetNode*> applicable_nodes;
	applicable_nodes.clear();

	auto AddApplicableNodes = [element](const StyleSheetIndex::NodeIndex& node_index, const String& key) {
		auto it_nodes = node_index.find(Hash<String>()(key));
		if (it_nodes != node_index.end())
		{
			const StyleSheetIndex::NodeList& nodes = it_nodes->second;

			for (const StyleSheetNode* node : nodes)
			{
				// We found a node that has at least one requirement matching the element. Now see if we satisfy the remaining requirements of the
				// node, including all ancestor nodes. What this involves is traversing the style nodes backwards, trying to match nodes in the
				// element's hierarchy to nodes in the style hierarchy.
				if (node->IsApplicable(element, nullptr))
					applicable_nodes.push_back(node);
			}
		}
	};

	// See if there are any styles defined for this element.
	const String& tag = element->GetTagName();
	const String& id = element->GetId();
	const StringList& class_names = element->GetStyle()->GetClassNameList();

	// Text elements are never matched.
	if (tag == "#text")
		return nullptr;

	// First, look up the indexed requirements.
	if (!id.empty())
		AddApplicableNodes(styled_node_index.ids, id);

	for (const String& name : class_names)
		AddApplicableNodes(styled_node_index.classes, name);

	AddApplicableNodes(styled_node_index.tags, tag);

	// Also check all remaining nodes that don't contain any indexed requirements.
	for (const StyleSheetNode* node : styled_node_index.other)
	{
		if (node->IsApplicable(element, nullptr))
			applicable_nodes.push_back(node);
	}

	// If this element definition won't actually store any information, don't bother with it.
	if (applicable_nodes.empty())
		return nullptr;

	// Sort the applicable nodes by specificity first, then by pointer value in case we have duplicate specificities.
	std::sort(applicable_nodes.begin(), applicable_nodes.end(), [](const StyleSheetNode* a, const StyleSheetNode* b) {
		const int a_specificity = a->GetSpecificity();
		const int b_specificity = b->GetSpecificity();
		if (a_specificity == b_specificity)
			return a < b;
		return a_specificity < b_specificity;
	});

	// Check if this puppy has already been cached in the node index.
	SharedPtr<const ElementDefinition>& definition = node_cache[applicable_nodes];
	if (!definition)
	{
		// Otherwise, create a new definition and add it to our cache.
		definition = MakeShared<const ElementDefinition>(applicable_nodes);
	}

	return definition;
}